

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvactxinfo.c
# Opt level: O2

uint32_t ctxsize_strands(uint32_t reg_base)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  nva_card **ppnVar4;
  uint32_t uVar5;
  ulong uVar6;
  void *pvVar7;
  int iVar8;
  
  ppnVar4 = nva_cards;
  pvVar7 = nva_cards[cnum]->bar0;
  iVar1 = *(int *)((long)pvVar7 + (ulong)(reg_base + 0x2880));
  uVar3 = reg_base + 0x20ac;
  if (dev < 0x101) {
    uVar3 = reg_base + 0x2ffc;
  }
  uVar6 = (ulong)uVar3;
  uVar2 = *(undefined4 *)((long)pvVar7 + uVar6);
  uVar5 = 0;
  for (iVar8 = 0; iVar1 != iVar8; iVar8 = iVar8 + 1) {
    *(int *)((long)pvVar7 + uVar6) = iVar8;
    pvVar7 = ppnVar4[cnum]->bar0;
    uVar5 = uVar5 + *(int *)((long)pvVar7 + (ulong)(reg_base + 0x2910)) * 4;
  }
  *(undefined4 *)((long)pvVar7 + uVar6) = uVar2;
  return uVar5;
}

Assistant:

uint32_t ctxsize_strands(uint32_t reg_base)
{
	uint32_t strand_count, strand_size = 0, io_idx, i;
	uint32_t host_io_port_off = dev > 0x100 ? 0x20ac : 0x2ffc;

	strand_count = nva_rd32(cnum, reg_base + 0x2880);
	io_idx = nva_rd32(cnum, reg_base + host_io_port_off);

	for (i = 0; i < strand_count; i++) {
		nva_wr32(cnum, reg_base + host_io_port_off, i);
		strand_size += (nva_rd32(cnum, reg_base + 0x2910) << 2);
	}
	nva_wr32(cnum, reg_base + host_io_port_off, io_idx);

	return strand_size;
}